

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftlib.c
# Opt level: O0

void rfft2pt(float *ioptr)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float t0i;
  float t0r;
  float f1i;
  float f1r;
  float f0i;
  float f0r;
  float *ioptr_local;
  
  fVar1 = *ioptr;
  fVar2 = ioptr[1];
  fVar3 = fVar1 + ioptr[2];
  fVar4 = fVar2 + ioptr[3];
  *ioptr = fVar3 + fVar4;
  ioptr[1] = fVar3 - fVar4;
  ioptr[2] = fVar1 - ioptr[2];
  ioptr[3] = ioptr[3] - fVar2;
  return;
}

Assistant:

static inline void rfft2pt(float *ioptr){
/***   RADIX 4 rfft	***/
float f0r, f0i, f1r, f1i;
float t0r, t0i;

	/* bit reversed load */
f0r = ioptr[0];
f0i = ioptr[1];
f1r = ioptr[2];
f1i = ioptr[3];

		/* Butterflys		*/
		/*
		f0	-	-	t0
		f1	-  1 -	f1
		*/

t0r = f0r + f1r;
t0i = f0i + f1i;
f1r = f0r - f1r;
f1i = f1i - f0i;
	/* finish rfft */
f0r = 	t0r + t0i;
f0i = 	t0r - t0i;

	/* store result */
ioptr[0] = f0r;
ioptr[1] = f0i;
ioptr[2] = f1r;
ioptr[3] = f1i;
}